

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O0

int Saig_SynchSequenceRun(Aig_Man_t *pAig,Vec_Ptr_t *vSimInfo,Vec_Str_t *vSequence,int fTernary)

{
  Vec_Ptr_t *p;
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  void *pvVar6;
  uint *puVar7;
  int local_48;
  int i;
  int Value;
  int nIters;
  int Counter;
  Aig_Obj_t *pObj;
  uint *pSim;
  int fTernary_local;
  Vec_Str_t *vSequence_local;
  Vec_Ptr_t *vSimInfo_local;
  Aig_Man_t *pAig_local;
  
  iVar1 = Vec_StrSize(vSequence);
  iVar2 = Saig_ManPiNum(pAig);
  if (iVar1 % iVar2 != 0) {
    __assert_fail("Vec_StrSize(vSequence) % Saig_ManPiNum(pAig) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigSynch.c"
                  ,0x16e,"int Saig_SynchSequenceRun(Aig_Man_t *, Vec_Ptr_t *, Vec_Str_t *, int)");
  }
  iVar1 = Vec_StrSize(vSequence);
  iVar2 = Saig_ManPiNum(pAig);
  Saig_SynchSetConstant1(pAig,vSimInfo,1);
  if (fTernary == 0) {
    Saig_SynchInitRegsBinary(pAig,vSimInfo,1);
  }
  else {
    Saig_SynchInitRegsTernary(pAig,vSimInfo,1);
  }
  for (local_48 = 0; local_48 < iVar1 / iVar2; local_48 = local_48 + 1) {
    pcVar5 = Vec_StrArray(vSequence);
    iVar3 = Saig_ManPiNum(pAig);
    Saig_SynchInitPisGiven(pAig,vSimInfo,1,pcVar5 + local_48 * iVar3);
    Saig_SynchTernarySimulate(pAig,vSimInfo,1);
    Saig_SynchTernaryTransferState(pAig,vSimInfo,1);
  }
  Value = 0;
  local_48 = 0;
  while( true ) {
    iVar1 = Saig_ManRegNum(pAig);
    if (iVar1 <= local_48) {
      return Value;
    }
    p = pAig->vCis;
    iVar1 = Saig_ManPiNum(pAig);
    pvVar6 = Vec_PtrEntry(p,local_48 + iVar1);
    puVar7 = (uint *)Vec_PtrEntry(vSimInfo,*(int *)((long)pvVar6 + 0x24));
    uVar4 = *puVar7 & 3;
    if (uVar4 == 2) break;
    Value = (uint)(uVar4 == 3) + Value;
    *(ulong *)((long)pvVar6 + 0x18) =
         *(ulong *)((long)pvVar6 + 0x18) & 0xffffffffffffffef | ((ulong)uVar4 & 1) << 4;
    local_48 = local_48 + 1;
  }
  __assert_fail("Value != 2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigSynch.c"
                ,0x181,"int Saig_SynchSequenceRun(Aig_Man_t *, Vec_Ptr_t *, Vec_Str_t *, int)");
}

Assistant:

int Saig_SynchSequenceRun( Aig_Man_t * pAig, Vec_Ptr_t * vSimInfo, Vec_Str_t * vSequence, int fTernary )
{
    unsigned * pSim;
    Aig_Obj_t * pObj;
    int Counter, nIters, Value, i;
    assert( Vec_StrSize(vSequence) % Saig_ManPiNum(pAig) == 0 );
    nIters = Vec_StrSize(vSequence) / Saig_ManPiNum(pAig);
    Saig_SynchSetConstant1( pAig, vSimInfo, 1 );
    if ( fTernary )
        Saig_SynchInitRegsTernary( pAig, vSimInfo, 1 ); 
    else
        Saig_SynchInitRegsBinary( pAig, vSimInfo, 1 ); 
    for ( i = 0; i < nIters; i++ )
    {
        Saig_SynchInitPisGiven( pAig, vSimInfo, 1, Vec_StrArray(vSequence) + i * Saig_ManPiNum(pAig) );
        Saig_SynchTernarySimulate( pAig, vSimInfo, 1 );
        Saig_SynchTernaryTransferState( pAig, vSimInfo, 1 );
    }
    // save the resulting state in the registers
    Counter = 0;
    Saig_ManForEachLo( pAig, pObj, i )
    {
        pSim = (unsigned *)Vec_PtrEntry( vSimInfo, pObj->Id );
        Value = pSim[0] & 3;
        assert( Value != 2 );
        Counter += (Value == 3);
        pObj->fMarkA = Value;
    }
    return Counter;
}